

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

QString * QMakeInternal::IoUtils::resolvePath
                    (QString *__return_storage_ptr__,QString *baseDir,QString *fileName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_001e36aa;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    bVar1 = isAbsolutePath(fileName);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_001e36aa:
        __stack_chk_fail();
      }
      QDir::cleanPath((QString *)__return_storage_ptr__);
    }
    else {
      local_38.a.b.ch = '/';
      local_38.a.a = baseDir;
      local_38.b = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&>::
      convertTo<QString>((QString *)&local_50,&local_38);
      QDir::cleanPath((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_001e36aa;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString IoUtils::resolvePath(const QString &baseDir, const QString &fileName)
{
    if (fileName.isEmpty())
        return QString();
    if (isAbsolutePath(fileName))
        return QDir::cleanPath(fileName);
#ifdef Q_OS_WIN // Add drive to otherwise-absolute path:
    if (fileName.at(0).unicode() == '/' || fileName.at(0).unicode() == '\\') {
        Q_ASSERT_X(isAbsolutePath(baseDir), "IoUtils::resolvePath", qUtf8Printable(baseDir));
        return QDir::cleanPath(baseDir.left(2) + fileName);
    }
#endif // Q_OS_WIN
    return QDir::cleanPath(baseDir + QLatin1Char('/') + fileName);
}